

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

uint UFPC::Merge(uint i,uint j)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  uint root;
  uint t;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  puVar1 = P_;
  uVar3 = (ulong)i;
  do {
    uVar2 = (uint)uVar3;
    puVar4 = P_ + uVar3;
    uVar3 = (ulong)*puVar4;
  } while (*puVar4 < uVar2);
  uVar6 = j;
  if (i != j) {
    do {
      uVar5 = uVar6;
      uVar6 = P_[uVar5];
    } while (P_[uVar5] < uVar5);
    if (uVar2 < uVar5) {
      uVar5 = uVar2;
    }
    uVar2 = uVar5;
    puVar4 = P_ + j;
    uVar6 = *puVar4;
    if (*puVar4 < j) {
      do {
        *puVar4 = uVar2;
        puVar4 = puVar1 + uVar6;
        bVar7 = *puVar4 < uVar6;
        uVar6 = *puVar4;
      } while (bVar7);
    }
    *puVar4 = uVar2;
  }
  puVar4 = puVar1 + i;
  uVar6 = *puVar4;
  if (*puVar4 < i) {
    do {
      *puVar4 = uVar2;
      puVar4 = puVar1 + uVar6;
      bVar7 = *puVar4 < uVar6;
      uVar6 = *puVar4;
    } while (bVar7);
  }
  *puVar4 = uVar2;
  return uVar2;
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (P_[root] < root) {
            root = P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (P_[root_j] < root_j) {
                root_j = P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (P_[j] < j) {
                unsigned t = P_[j];
                P_[j] = root;
                j = t;
            }
            P_[j] = root;
        }
        // SetRoot(i, root);
        while (P_[i] < i) {
            unsigned t = P_[i];
            P_[i] = root;
            i = t;
        }
        P_[i] = root;
        return root;
    }